

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcS.c
# Opt level: O0

int Bmcs_ManPerform_Solve
              (Bmcs_Man_t *p,int iLit,pthread_t *WorkerThread,Par_ThData_t *ThData,int nProcs,
              int *pSolver)

{
  int local_40;
  int local_3c;
  int status;
  int i;
  int *pSolver_local;
  int nProcs_local;
  Par_ThData_t *ThData_local;
  pthread_t *WorkerThread_local;
  int iLit_local;
  Bmcs_Man_t *p_local;
  
  local_40 = -1;
  for (local_3c = 0; local_3c < nProcs; local_3c = local_3c + 1) {
    ThData[local_3c].iLit = iLit;
    if (ThData[local_3c].fWorking != 0) {
      __assert_fail("ThData[i].fWorking == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmcS.c"
                    ,0x306,
                    "int Bmcs_ManPerform_Solve(Bmcs_Man_t *, int, pthread_t *, Par_ThData_t *, int, int *)"
                   );
    }
  }
  for (local_3c = 0; local_3c < nProcs; local_3c = local_3c + 1) {
    ThData[local_3c].fWorking = 1;
  }
  do {
    if (local_3c != nProcs) {
      while (local_3c < nProcs) {
        local_3c = 0;
        while ((local_3c < nProcs && (ThData[local_3c].fWorking == 0))) {
          local_3c = local_3c + 1;
        }
      }
      local_3c = 0;
      while( true ) {
        if (nProcs <= local_3c) {
          p->fStopNow = 0;
          return local_40;
        }
        ThData[local_3c].iLit = -1;
        if (ThData[local_3c].fWorking != 0) break;
        local_3c = local_3c + 1;
      }
      __assert_fail("ThData[i].fWorking == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmcS.c"
                    ,0x325,
                    "int Bmcs_ManPerform_Solve(Bmcs_Man_t *, int, pthread_t *, Par_ThData_t *, int, int *)"
                   );
    }
    for (local_3c = 0; local_3c < nProcs; local_3c = local_3c + 1) {
      if (ThData[local_3c].fWorking == 0) {
        p->fStopNow = 1;
        local_40 = ThData[local_3c].status;
        *pSolver = local_3c;
        break;
      }
    }
  } while( true );
}

Assistant:

int Bmcs_ManPerform_Solve( Bmcs_Man_t * p, int iLit, pthread_t * WorkerThread, Par_ThData_t * ThData, int nProcs, int * pSolver )
{
    int i, status = -1;
    // set new problem
    for ( i = 0; i < nProcs; i++ )
    {
        ThData[i].iLit = iLit;
        assert( ThData[i].fWorking == 0 );
    }
    // start solvers on a new problem
    for ( i = 0; i < nProcs; i++ )
        ThData[i].fWorking = 1;
    // check if any of the solvers finished
    while ( i == nProcs )
    {
        for ( i = 0; i < nProcs; i++ )
        {
            if ( ThData[i].fWorking )
                continue;
            // set stop request
            p->fStopNow = 1;
            // remember status
            status = ThData[i].status;
            //printf( "Solver %d returned status %d.\n", i, status );
            *pSolver = i;
            break;
        }
    }
    // wait till threads finish
    while ( i < nProcs )
    {
        for ( i = 0; i < nProcs; i++ )
            if ( ThData[i].fWorking )
                break;
    }
    for ( i = 0; i < nProcs; i++ )
    {
        ThData[i].iLit = -1;
        assert( ThData[i].fWorking == 0 );
    }
    // reset stop request
    p->fStopNow = 0;
    return status;
}